

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O2

string * FormatScript_abi_cxx11_(string *__return_storage_ptr__,CScript *script)

{
  uint uVar1;
  long lVar2;
  const_iterator __first;
  bool bVar3;
  __type_conflict _Var4;
  CScript *pCVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  int iVar8;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  allocator_type local_121;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  allocator_type local_101;
  undefined1 local_100 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  opcodetype op;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string str;
  string ret;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ret._M_dataplus._M_p = (pointer)&ret.field_2;
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
  it.ptr = (uchar *)script;
  if (0x1c < (script->super_CScriptBase)._size) {
    it.ptr = (uchar *)(script->super_CScriptBase)._union.indirect_contents.indirect;
  }
  do {
    __first.ptr = it.ptr;
    uVar1 = (script->super_CScriptBase)._size;
    uVar6 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar6 = uVar1;
    }
    pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar5 = script;
    }
    if (it.ptr == (uchar *)((pCVar5->super_CScriptBase)._union.direct + (int)uVar6)) break;
    vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = CScript::GetOp(script,&it,&op,&vch);
    if (bVar3) {
      if (op == OP_0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&ret,"0 ");
        iVar8 = 2;
      }
      else {
        if (op == OP_1NEGATE || op - OP_1 < 0x10) {
          local_98._M_dataplus._M_p._0_4_ = op - OP_RESERVED;
          tinyformat::format<int>(&str,"%i ",(int *)&local_98);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&ret,&str);
          std::__cxx11::string::~string((string *)&str);
        }
        else {
          if (op - OP_NOP < 0x59) {
            GetOpName_abi_cxx11_(&str,op);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_98,&str,0,3);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b8,"OP_",(allocator<char> *)local_100);
            _Var4 = std::operator==(&local_98,&local_b8);
            std::__cxx11::string::~string((string *)&local_b8);
            std::__cxx11::string::~string((string *)&local_98);
            iVar8 = 0;
            if (_Var4) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_b8,&str,3,0xffffffffffffffff);
              std::operator+(&local_98,&local_b8," ");
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&ret,&local_98);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_b8);
              iVar8 = 2;
            }
            std::__cxx11::string::~string((string *)&str);
            if (_Var4) goto LAB_0057e537;
          }
          if (vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,__first,it,
                       (allocator_type *)pbVar7);
            s_02.m_size = local_b8._M_string_length - (long)local_b8._M_dataplus._M_p;
            s_02.m_data = (uchar *)local_b8._M_dataplus._M_p;
            HexStr_abi_cxx11_(&local_98,s_02);
            tinyformat::format<std::__cxx11::string>
                      (&str,(tinyformat *)0x71c6b2,(char *)&local_98,pbVar7);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&ret,&str);
            std::__cxx11::string::~string((string *)&str);
            std::__cxx11::string::~string((string *)&local_98);
            pbVar7 = &local_b8;
          }
          else {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_100,__first,
                       (const_iterator)
                       (it.ptr + -(ulong)(uint)((int)vch.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (int)vch.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)),
                       &local_101);
            s_00.m_size = local_100._8_8_ - local_100._0_8_;
            s_00.m_data = (uchar *)local_100._0_8_;
            HexStr_abi_cxx11_(&local_98,s_00);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_120,
                       (const_iterator)
                       (it.ptr + -(ulong)(uint)((int)vch.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (int)vch.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)),it,
                       &local_121);
            s_01.m_size = (long)local_120._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_120._M_impl.super__Vector_impl_data._M_start;
            s_01.m_data = local_120._M_impl.super__Vector_impl_data._M_start;
            HexStr_abi_cxx11_(&local_b8,s_01);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&str,(tinyformat *)"0x%x 0x%x ",(char *)&local_98,&local_b8,in_R8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&ret,&str);
            std::__cxx11::string::~string((string *)&str);
            std::__cxx11::string::~string((string *)&local_b8);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_120);
            std::__cxx11::string::~string((string *)&local_98);
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pbVar7);
        }
        iVar8 = 2;
      }
    }
    else {
      uVar1 = (script->super_CScriptBase)._size;
      uVar6 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar6 = uVar1;
      }
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar1 < 0x1d) {
        pCVar5 = script;
      }
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,__first,
                 (uchar *)((long)&(pCVar5->super_CScriptBase)._union + (long)(int)uVar6),
                 (allocator_type *)pbVar7);
      s.m_size = local_b8._M_string_length - (long)local_b8._M_dataplus._M_p;
      s.m_data = (uchar *)local_b8._M_dataplus._M_p;
      HexStr_abi_cxx11_(&local_98,s);
      tinyformat::format<std::__cxx11::string>(&str,(tinyformat *)0x71c6b2,(char *)&local_98,pbVar7)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&ret,&str);
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&local_98);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
      iVar8 = 3;
    }
LAB_0057e537:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  } while (iVar8 == 2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (__return_storage_ptr__,&ret,0,ret._M_string_length - 1);
  std::__cxx11::string::~string((string *)&ret);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatScript(const CScript& script)
{
    std::string ret;
    CScript::const_iterator it = script.begin();
    opcodetype op;
    while (it != script.end()) {
        CScript::const_iterator it2 = it;
        std::vector<unsigned char> vch;
        if (script.GetOp(it, op, vch)) {
            if (op == OP_0) {
                ret += "0 ";
                continue;
            } else if ((op >= OP_1 && op <= OP_16) || op == OP_1NEGATE) {
                ret += strprintf("%i ", op - OP_1NEGATE - 1);
                continue;
            } else if (op >= OP_NOP && op <= OP_NOP10) {
                std::string str(GetOpName(op));
                if (str.substr(0, 3) == std::string("OP_")) {
                    ret += str.substr(3, std::string::npos) + " ";
                    continue;
                }
            }
            if (vch.size() > 0) {
                ret += strprintf("0x%x 0x%x ", HexStr(std::vector<uint8_t>(it2, it - vch.size())),
                                               HexStr(std::vector<uint8_t>(it - vch.size(), it)));
            } else {
                ret += strprintf("0x%x ", HexStr(std::vector<uint8_t>(it2, it)));
            }
            continue;
        }
        ret += strprintf("0x%x ", HexStr(std::vector<uint8_t>(it2, script.end())));
        break;
    }
    return ret.substr(0, ret.empty() ? ret.npos : ret.size() - 1);
}